

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O2

UChar32 __thiscall icu_63::UCharCharacterIterator::current32(UCharCharacterIterator *this)

{
  char16_t cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char16_t *pcVar5;
  uint uVar6;
  uint uVar7;
  
  iVar2 = (this->super_CharacterIterator).pos;
  iVar3 = (this->super_CharacterIterator).begin;
  uVar6 = 0xffff;
  if ((iVar3 <= iVar2) && (iVar4 = (this->super_CharacterIterator).end, iVar2 < iVar4)) {
    pcVar5 = this->text;
    cVar1 = pcVar5[iVar2];
    uVar6 = (uint)(ushort)cVar1;
    if ((cVar1 & 0xf800U) == 0xd800) {
      if (((ushort)cVar1 >> 10 & 1) == 0) {
        if (iVar2 + 1 == iVar4) {
          return uVar6;
        }
        uVar7 = (uint)(ushort)pcVar5[iVar2 + 1];
        if ((pcVar5[iVar2 + 1] & 0xfc00U) != 0xdc00) {
          return uVar6;
        }
        uVar6 = (uint)(ushort)cVar1 << 10;
      }
      else {
        if (iVar2 <= iVar3) {
          return uVar6;
        }
        if ((pcVar5[(long)iVar2 + -1] & 0xfc00U) != 0xd800) {
          return uVar6;
        }
        uVar7 = (uint)(ushort)pcVar5[(long)iVar2 + -1] << 10;
      }
      uVar6 = uVar6 + uVar7 + 0xfca02400;
    }
  }
  return uVar6;
}

Assistant:

UChar32
UCharCharacterIterator::current32() const {
    if (pos >= begin && pos < end) {
        UChar32 c;
        U16_GET(text, begin, pos, end, c);
        return c;
    } else {
        return DONE;
    }
}